

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

void __thiscall
opengv::math::Sturm::bracketRoots
          (Sturm *this,vector<double,_std::allocator<double>_> *roots,double eps)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  bool bVar3;
  Bracket *this_00;
  _List_node_base *p_Var4;
  size_t sVar5;
  _List_node_base *p_Var6;
  _Self __tmp;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 in_XMM2 [16];
  Ptr bracket;
  double local_78;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  stack;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_48 = computeLagrangianBound(this);
  stack.
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&stack;
  stack.
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node._M_size = 0;
  stack.
  super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       stack.
       super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  uStack_40 = extraout_XMM0_Qb;
  this_00 = (Bracket *)operator_new(0x30);
  auVar2._8_8_ = uStack_40;
  auVar2._0_8_ = local_48;
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar2,auVar7);
  Bracket::Bracket(this_00,auVar7._0_8_,local_48);
  std::__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<opengv::math::Bracket,void>
            ((__shared_ptr<opengv::math::Bracket,(__gnu_cxx::_Lock_policy)2> *)&bracket,this_00);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back(&stack,&bracket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  p_Var1 = stack.
           super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var4 = (_List_node_base *)evaluateChain2(this,(double)p_Var1->_M_prev);
  p_Var1[2]._M_next = p_Var4;
  *(undefined1 *)&p_Var1[1]._M_prev = 1;
  p_Var1 = stack.
           super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var4 = (_List_node_base *)evaluateChain2(this,(double)p_Var1[1]._M_next);
  p_Var1[2]._M_prev = p_Var4;
  *(undefined1 *)((long)&p_Var1[1]._M_prev + 1) = 1;
  local_78 = eps;
  if (eps < 0.0) {
    sVar5 = Bracket::numberRoots
                      ((Bracket *)
                       stack.
                       super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next);
    auVar7 = vcvtusi2sd_avx512f(in_XMM2,sVar5);
    local_78 = local_48 / (auVar7._0_8_ * 10.0);
  }
  sVar5 = Bracket::numberRoots
                    ((Bracket *)
                     stack.
                     super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next);
  std::vector<double,_std::allocator<double>_>::reserve(roots,sVar5);
  while (stack.
         super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&stack) {
    std::__shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2> *)
               (stack.
                super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::pop_front(&stack);
    bVar3 = Bracket::dividable(bracket.
                               super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,local_78);
    if (bVar3) {
      Bracket::divide(bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&stack);
      p_Var4 = stack.
               super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      p_Var6 = (_List_node_base *)
               evaluateChain2(this,(double)(stack.
                                            super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                                            ._M_impl._M_node.super__List_node_base._M_prev[1].
                                           _M_next)->_M_prev);
      p_Var1 = p_Var4[1]._M_next;
      p_Var1[2]._M_next = p_Var6;
      *(undefined1 *)&p_Var1[1]._M_prev = 1;
      p_Var1 = p_Var4->_M_prev[1]._M_next;
      p_Var1[2]._M_prev = p_Var6;
      *(undefined1 *)((long)&p_Var1[1]._M_prev + 1) = 1;
    }
    else {
      sVar5 = Bracket::numberRoots
                        (bracket.
                         super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (sVar5 != 0) {
        local_50 = ((bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_lowerBound +
                   (bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_upperBound) * 0.5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(roots,&local_50);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bracket.super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::_M_clear(&stack.
              super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
            );
  return;
}

Assistant:

void
opengv::math::Sturm::bracketRoots( std::vector<double> & roots, double eps )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  
  double localEps = eps;
  if( eps < 0.0 )
    localEps = absoluteBound / (10.0 * stack.back()->numberRoots());
  roots.reserve(stack.back()->numberRoots());
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable( localEps) )
    {
      bracket->divide(stack);
      std::list<Bracket::Ptr>::iterator it = stack.end();
      it--;
      size_t changes = evaluateChain2((*it)->lowerBound());
      (*it)->setLowerBoundChanges(changes);
      it--;
      (*it)->setUpperBoundChanges(changes);
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}